

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O3

archive * archive_write_disk_new(void)

{
  __mode_t __mask;
  __uid_t _Var1;
  archive *__ptr;
  size_t sVar2;
  archive_string *paVar3;
  
  __ptr = (archive *)calloc(1,0x328);
  if (__ptr != (archive *)0x0) {
    __ptr->magic = 0xc001b0c5;
    __ptr->state = 2;
    __ptr->vtable = &archive_write_disk_vtable;
    sVar2 = time((time_t *)0x0);
    __ptr[1].error_string.length = sVar2;
    __mask = umask(0);
    __ptr[1].magic = __mask;
    umask(__mask);
    _Var1 = geteuid();
    __ptr[1].archive_format_name = (char *)(ulong)_Var1;
    paVar3 = archive_string_ensure((archive_string *)&__ptr[1].read_data_output_offset,0x200);
    if (paVar3 != (archive_string *)0x0) {
      *(undefined1 *)__ptr[1].read_data_output_offset = 0;
      __ptr[5].current_oemcp = 5;
      return __ptr;
    }
    free(__ptr);
  }
  return (archive *)0x0;
}

Assistant:

struct archive *
archive_write_disk_new(void)
{
	struct archive_write_disk *a;

	a = (struct archive_write_disk *)calloc(1, sizeof(*a));
	if (a == NULL)
		return (NULL);
	a->archive.magic = ARCHIVE_WRITE_DISK_MAGIC;
	/* We're ready to write a header immediately. */
	a->archive.state = ARCHIVE_STATE_HEADER;
	a->archive.vtable = &archive_write_disk_vtable;
	a->start_time = time(NULL);
	/* Query and restore the umask. */
	umask(a->user_umask = umask(0));
#ifdef HAVE_GETEUID
	a->user_uid = geteuid();
#endif /* HAVE_GETEUID */
	if (archive_string_ensure(&a->path_safe, 512) == NULL) {
		free(a);
		return (NULL);
	}
	a->path_safe.s[0] = 0;

#ifdef HAVE_ZLIB_H
	a->decmpfs_compression_level = 5;
#endif
	return (&a->archive);
}